

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasCustomLayer(Model *model)

{
  RepeatedPtrFieldBase *this;
  Type *pTVar1;
  int i;
  int index;
  bool bVar2;
  
  this = &getNNSpec(model)->super_RepeatedPtrFieldBase;
  index = 0;
  if (this == (RepeatedPtrFieldBase *)0x0) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = index < this->current_size_;
      if (this->current_size_ <= index) {
        return bVar2;
      }
      pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (this,index);
      index = index + 1;
    } while (pTVar1->_oneof_case_[0] != 500);
  }
  return bVar2;
}

Assistant:

bool CoreML::hasCustomLayer(const Specification::Model& model) {
    auto layers = getNNSpec(model);
    if (layers) {
        for (int i =0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if (layer.layer_case() == Specification::NeuralNetworkLayer::kCustom) {
                return true;
            }
        }
    }
    return false;
}